

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bconcat(bstring b0,const_bstring b1)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  const_bstring b;
  long lVar5;
  uint uVar6;
  
  if (b1 == (const_bstring)0x0 || b0 == (bstring)0x0) {
    return -1;
  }
  if (b0->data == (uchar *)0x0) {
    return -1;
  }
  if (b1->data == (uchar *)0x0) {
    return -1;
  }
  uVar1 = b0->slen;
  uVar2 = b1->slen;
  iVar4 = b0->mlen;
  uVar6 = uVar2 + uVar1;
  if ((int)(uVar1 | uVar2 | iVar4 - uVar1 | uVar6) < 0) {
    return -1;
  }
  b = b1;
  if ((int)(uVar6 + 1) < iVar4) goto LAB_0014ef51;
  lVar5 = (long)b1->data - (long)b0->data;
  if ((lVar5 < iVar4 && -1 < lVar5) && (b = bstrcpy(b1), b == (bstring)0x0)) {
    b = (bstring)0x0;
LAB_0014ef4b:
    bVar3 = false;
  }
  else {
    iVar4 = balloc(b0,uVar6 + 1);
    if (iVar4 != 0) {
      if (b != b1) {
        bdestroy(b);
      }
      goto LAB_0014ef4b;
    }
    bVar3 = true;
  }
  if (!bVar3) {
    return -1;
  }
LAB_0014ef51:
  if (uVar2 != 0) {
    memmove(b0->data + (int)uVar1,b->data,(long)(int)uVar2);
  }
  b0->data[(int)uVar6] = '\0';
  b0->slen = uVar6;
  if (b != b1) {
    bdestroy(b);
  }
  return 0;
}

Assistant:

int bconcat (bstring b0, const_bstring b1) {
int len, d;
bstring aux = (bstring) b1;

	if (b0 == NULL || b1 == NULL || b0->data == NULL || b1->data == NULL)
		return BSTR_ERR;

	d = b0->slen;
	len = b1->slen;
	if ((d | (b0->mlen - d) | len | (d + len)) < 0) return BSTR_ERR;

	if (b0->mlen <= d + len + 1) {
		ptrdiff_t pd = b1->data - b0->data;
		if (0 <= pd && pd < b0->mlen) {
			if (NULL == (aux = bstrcpy (b1))) return BSTR_ERR;
		}
		if (balloc (b0, d + len + 1) != BSTR_OK) {
			if (aux != b1) bdestroy (aux);
			return BSTR_ERR;
		}
	}

	bBlockCopy (&b0->data[d], &aux->data[0], (size_t) len);
	b0->data[d + len] = (unsigned char) '\0';
	b0->slen = d + len;
	if (aux != b1) bdestroy (aux);
	return BSTR_OK;
}